

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed.c++
# Opt level: O2

ssize_t __thiscall
capnp::_::PackedOutputStream::write(PackedOutputStream *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  long lVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte bVar10;
  ulong uVar11;
  long extraout_RDX;
  long extraout_RDX_00;
  byte *pbVar12;
  byte *pbVar13;
  byte *pbVar14;
  undefined4 in_register_00000034;
  ulong uVar15;
  ulong uVar16;
  byte bVar17;
  uint64_t *inWord;
  byte *__src;
  byte *pbVar18;
  byte *pbVar19;
  undefined1 auVar20 [16];
  long local_60;
  byte slowBuffer [20];
  
  iVar9 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
  pbVar18 = (byte *)CONCAT44(extraout_var,iVar9);
  slowBuffer[0x10] = '\0';
  slowBuffer[0x11] = '\0';
  slowBuffer[0x12] = '\0';
  slowBuffer[0x13] = '\0';
  slowBuffer[0] = '\0';
  slowBuffer[1] = '\0';
  slowBuffer[2] = '\0';
  slowBuffer[3] = '\0';
  slowBuffer[4] = '\0';
  slowBuffer[5] = '\0';
  slowBuffer[6] = '\0';
  slowBuffer[7] = '\0';
  slowBuffer[8] = '\0';
  slowBuffer[9] = '\0';
  slowBuffer[10] = '\0';
  slowBuffer[0xb] = '\0';
  slowBuffer[0xc] = '\0';
  slowBuffer[0xd] = '\0';
  slowBuffer[0xe] = '\0';
  slowBuffer[0xf] = '\0';
  pbVar12 = (byte *)((long)__buf + (long)CONCAT44(in_register_00000034,__fd));
  pbVar13 = (byte *)CONCAT44(in_register_00000034,__fd);
  pbVar19 = pbVar18;
  local_60 = extraout_RDX;
  do {
    while( true ) {
      pbVar14 = pbVar13;
      if (pbVar12 <= pbVar14) {
        iVar9 = (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                          (this->inner,pbVar19,(long)pbVar18 - (long)pbVar19);
        return CONCAT44(extraout_var_01,iVar9);
      }
      pbVar13 = pbVar18;
      if ((long)(pbVar19 + (local_60 - (long)pbVar18)) < 10) {
        (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                  (this->inner,pbVar19,(long)pbVar18 - (long)pbVar19);
        pbVar13 = slowBuffer;
        local_60 = 0x14;
        pbVar19 = pbVar13;
      }
      bVar17 = *pbVar14;
      uVar11 = (ulong)(bVar17 != 0);
      pbVar13[1] = bVar17;
      lVar1 = uVar11 + 1;
      bVar10 = pbVar14[1];
      uVar15 = (ulong)(bVar10 != 0);
      pbVar13[uVar11 + 1] = bVar10;
      lVar8 = uVar15 + lVar1;
      bVar2 = pbVar14[2];
      uVar11 = (ulong)(bVar2 != 0);
      pbVar13[uVar15 + lVar1] = bVar2;
      lVar1 = uVar11 + lVar8;
      bVar3 = pbVar14[3];
      uVar15 = (ulong)(bVar3 != 0);
      pbVar13[uVar11 + lVar8] = bVar3;
      lVar8 = uVar15 + lVar1;
      bVar4 = pbVar14[4];
      uVar16 = (ulong)(bVar4 != 0);
      pbVar13[uVar15 + lVar1] = bVar4;
      lVar1 = uVar16 + lVar8;
      bVar5 = pbVar14[5];
      uVar11 = (ulong)(bVar5 != 0);
      pbVar13[uVar16 + lVar8] = bVar5;
      lVar8 = uVar11 + lVar1;
      bVar6 = pbVar14[6];
      uVar15 = (ulong)(bVar6 != 0);
      pbVar13[uVar11 + lVar1] = bVar6;
      bVar7 = pbVar14[7];
      pbVar13[uVar15 + lVar8] = bVar7;
      pbVar18 = pbVar13 + (bVar7 != 0) + uVar15 + lVar8;
      __src = pbVar14 + 8;
      bVar17 = (bVar7 != 0) << 7 | (bVar6 != 0) << 6 |
               (bVar5 != 0) << 5 |
               (bVar4 != 0) << 4 |
               (bVar3 != 0) << 3 | (bVar2 != 0) << 2 | bVar17 != 0 | (bVar10 != 0) * '\x02';
      *pbVar13 = bVar17;
      if (bVar17 == 0xff) break;
      pbVar13 = __src;
      if (bVar17 == 0) {
        pbVar13 = pbVar14 + 0x800;
        if ((long)pbVar12 - (long)__src < 0x7f9) {
          pbVar13 = pbVar12;
        }
        bVar17 = 0;
        for (; (__src < pbVar13 && (*(long *)__src == 0)); __src = __src + 8) {
          bVar17 = bVar17 + 1;
        }
        *pbVar18 = bVar17;
        pbVar18 = pbVar18 + 1;
        pbVar13 = __src;
      }
    }
    pbVar14 = pbVar14 + 0x800;
    if ((ulong)((long)pbVar12 - (long)__src) < 0x7f9) {
      pbVar14 = pbVar12;
    }
    uVar11 = 0;
    bVar17 = 0;
    do {
      bVar10 = bVar17;
      uVar15 = uVar11;
      pbVar13 = __src + uVar15;
      if (pbVar14 <= pbVar13) break;
      lVar1 = *(long *)pbVar13;
      auVar20[0] = -((char)lVar1 == '\0');
      auVar20[1] = -((char)((ulong)lVar1 >> 8) == '\0');
      auVar20[2] = -((char)((ulong)lVar1 >> 0x10) == '\0');
      auVar20[3] = -((char)((ulong)lVar1 >> 0x18) == '\0');
      auVar20[4] = -((char)((ulong)lVar1 >> 0x20) == '\0');
      auVar20[5] = -((char)((ulong)lVar1 >> 0x28) == '\0');
      auVar20[6] = -((char)((ulong)lVar1 >> 0x30) == '\0');
      auVar20[7] = -((char)((ulong)lVar1 >> 0x38) == '\0');
      auVar20[8] = 0xff;
      auVar20[9] = 0xff;
      auVar20[10] = 0xff;
      auVar20[0xb] = 0xff;
      auVar20[0xc] = 0xff;
      auVar20[0xd] = 0xff;
      auVar20[0xe] = 0xff;
      auVar20[0xf] = 0xff;
      bVar2 = SUB161(auVar20 >> 7,0) & 1 | (SUB161(auVar20 >> 0xf,0) & 1) << 1 |
              (SUB161(auVar20 >> 0x17,0) & 1) << 2 | (SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
              (SUB161(auVar20 >> 0x27,0) & 1) << 4 | (SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
              (SUB161(auVar20 >> 0x37,0) & 1) << 6 | SUB161(auVar20 >> 0x3f,0) << 7;
      uVar11 = uVar15 + 8;
      bVar17 = bVar10 + 1;
    } while ((bVar2 & bVar2 - 1) == 0);
    uVar11 = uVar15 & 0xffffffff;
    *pbVar18 = bVar10;
    pbVar18 = pbVar18 + 1;
    if ((long)(pbVar19 + (local_60 - (long)pbVar18)) < (long)uVar11) {
      (*(this->inner->super_OutputStream)._vptr_OutputStream[2])
                (this->inner,pbVar19,(long)pbVar18 - (long)pbVar19);
      (*(this->inner->super_OutputStream)._vptr_OutputStream[2])(this->inner,__src,uVar15);
      iVar9 = (*(this->inner->super_OutputStream)._vptr_OutputStream[4])();
      pbVar18 = (byte *)CONCAT44(extraout_var_00,iVar9);
      pbVar19 = pbVar18;
      local_60 = extraout_RDX_00;
    }
    else {
      memcpy(pbVar18,__src,uVar11);
      pbVar18 = pbVar18 + uVar11;
    }
  } while( true );
}

Assistant:

void PackedOutputStream::write(kj::ArrayPtr<const byte> src) {
  kj::ArrayPtr<byte> buffer = inner.getWriteBuffer();
  byte slowBuffer[20]{};

  uint8_t* __restrict__ out = reinterpret_cast<uint8_t*>(buffer.begin());

  const uint8_t* __restrict__ in = src.begin();
  const uint8_t* const inEnd = src.end();

  while (in < inEnd) {
    if (reinterpret_cast<uint8_t*>(buffer.end()) - out < 10) {
      // Oops, we're out of space.  We need at least 10 bytes for the fast path, since we don't
      // bounds-check on every byte.

      // Write what we have so far.
      inner.write(buffer.first(out - reinterpret_cast<uint8_t*>(buffer.begin())));

      // Use a slow buffer into which we'll encode 10 to 20 bytes.  This should get us past the
      // output stream's buffer boundary.
      buffer = kj::arrayPtr(slowBuffer, sizeof(slowBuffer));
      out = reinterpret_cast<uint8_t*>(buffer.begin());
    }

    uint8_t* tagPos = out++;

#define HANDLE_BYTE(n) \
    uint8_t bit##n = *in != 0; \
    *out = *in; \
    out += bit##n; /* out only advances if the byte was non-zero */ \
    ++in

    HANDLE_BYTE(0);
    HANDLE_BYTE(1);
    HANDLE_BYTE(2);
    HANDLE_BYTE(3);
    HANDLE_BYTE(4);
    HANDLE_BYTE(5);
    HANDLE_BYTE(6);
    HANDLE_BYTE(7);
#undef HANDLE_BYTE

    uint8_t tag = (bit0 << 0) | (bit1 << 1) | (bit2 << 2) | (bit3 << 3)
                | (bit4 << 4) | (bit5 << 5) | (bit6 << 6) | (bit7 << 7);
    *tagPos = tag;

    if (tag == 0) {
      // An all-zero word is followed by a count of consecutive zero words (not including the
      // first one).

      // We can check a whole word at a time. (Here is where we use the assumption that
      // `src` is word-aligned.)
      const uint64_t* inWord = reinterpret_cast<const uint64_t*>(in);

      // The count must fit it 1 byte, so limit to 255 words.
      const uint64_t* limit = reinterpret_cast<const uint64_t*>(inEnd);
      if (limit - inWord > 255) {
        limit = inWord + 255;
      }

      while (inWord < limit && *inWord == 0) {
        ++inWord;
      }

      // Write the count.
      *out++ = inWord - reinterpret_cast<const uint64_t*>(in);

      // Advance input.
      in = reinterpret_cast<const uint8_t*>(inWord);

    } else if (tag == 0xffu) {
      // An all-nonzero word is followed by a count of consecutive uncompressed words, followed
      // by the uncompressed words themselves.

      // Count the number of consecutive words in the input which have no more than a single
      // zero-byte.  We look for at least two zeros because that's the point where our compression
      // scheme becomes a net win.
      // TODO(perf):  Maybe look for three zeros?  Compressing a two-zero word is a loss if the
      //   following word has no zeros.
      const uint8_t* runStart = in;

      const uint8_t* limit = inEnd;
      if ((size_t)(limit - in) > 255 * sizeof(word)) {
        limit = in + 255 * sizeof(word);
      }

      while (in < limit) {
        // Check eight input bytes for zeros.
        uint c = *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;
        c += *in++ == 0;

        if (c >= 2) {
          // Un-read the word with multiple zeros, since we'll want to compress that one.
          in -= 8;
          break;
        }
      }

      // Write the count.
      uint count = in - runStart;
      *out++ = count / sizeof(word);

      if (count <= reinterpret_cast<uint8_t*>(buffer.end()) - out) {
        // There's enough space to memcpy.
        memcpy(out, runStart, count);
        out += count;
      } else {
        // Input overruns the output buffer.  We'll give it to the output stream in one chunk
        // and let it decide what to do.
        inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
        inner.write(kj::arrayPtr(runStart, in - runStart));
        buffer = inner.getWriteBuffer();
        out = reinterpret_cast<uint8_t*>(buffer.begin());
      }
    }
  }

  // Write whatever is left.
  inner.write(buffer.first(reinterpret_cast<byte*>(out) - buffer.begin()));
}